

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msaa.c
# Opt level: O1

int main(int argc,char **argv)

{
  float *pfVar1;
  double dVar2;
  int iVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLint GVar7;
  GLFWwindow *handle;
  float *pfVar8;
  int i;
  long lVar9;
  int j;
  long lVar10;
  undefined8 *puVar11;
  long lVar12;
  undefined4 uVar13;
  float fVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  int samples;
  int height;
  int width;
  mat4x4 temp;
  GLuint vertex_buffer;
  mat4x4 m;
  mat4x4 mvp;
  mat4x4 p;
  GLint local_1b4;
  double local_1b0;
  GLuint local_1a4;
  int local_1a0;
  int local_19c;
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  ulong uStack_150;
  float local_148;
  uint local_144;
  undefined8 local_140;
  uint local_138;
  float local_134;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined4 local_120;
  undefined8 local_11c;
  undefined8 uStack_114;
  undefined4 local_10c;
  GLuint local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  ulong uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ulong uStack_80;
  float local_78 [13];
  undefined8 local_44;
  undefined4 local_3c;
  
  local_1b4 = 4;
  while( true ) {
    iVar3 = getopt(argc,argv,"hs:");
    if (iVar3 != 0x73) break;
    local_1b4 = atoi(optarg);
  }
  if (iVar3 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar3 = glfwInit();
    if (iVar3 != 0) {
      if (local_1b4 == 0) {
        puts("Requesting that MSAA not be available");
      }
      else {
        printf("Requesting MSAA with %i samples\n");
      }
      glfwWindowHint(0x2100d,local_1b4);
      glfwWindowHint(0x22002,2);
      glfwWindowHint(0x22003,0);
      handle = glfwCreateWindow(800,400,"Aliasing Detector",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle != (GLFWwindow *)0x0) {
        glfwSetKeyCallback(handle,key_callback);
        glfwMakeContextCurrent(handle);
        gladLoadGLLoader(glfwGetProcAddress);
        glfwSwapInterval(1);
        (*glad_glGetIntegerv)(0x80a9,&local_1b4);
        if (local_1b4 == 0) {
          puts("Context reports MSAA is unavailable");
        }
        else {
          printf("Context reports MSAA is available with %i samples\n");
        }
        (*glad_glGenBuffers)(1,&local_fc);
        (*glad_glBindBuffer)(0x8892,local_fc);
        (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
        GVar4 = (*glad_glCreateShader)(0x8b31);
        (*glad_glShaderSource)(GVar4,1,&vertex_shader_text,(GLint *)0x0);
        (*glad_glCompileShader)(GVar4);
        GVar5 = (*glad_glCreateShader)(0x8b30);
        (*glad_glShaderSource)(GVar5,1,&fragment_shader_text,(GLint *)0x0);
        (*glad_glCompileShader)(GVar5);
        GVar6 = (*glad_glCreateProgram)();
        (*glad_glAttachShader)(GVar6,GVar4);
        (*glad_glAttachShader)(GVar6,GVar5);
        (*glad_glLinkProgram)(GVar6);
        GVar7 = (*glad_glGetUniformLocation)(GVar6,"MVP");
        local_1a4 = GVar6;
        GVar4 = (*glad_glGetAttribLocation)(GVar6,"vPos");
        (*glad_glEnableVertexAttribArray)(GVar4);
        (*glad_glVertexAttribPointer)(GVar4,2,0x1406,'\0',8,(void *)0x0);
        iVar3 = glfwWindowShouldClose(handle);
        if (iVar3 == 0) {
          do {
            local_1b0 = glfwGetTime();
            local_1b0 = local_1b0 * 3.141592653589793;
            glfwGetFramebufferSize(handle,&local_19c,&local_1a0);
            local_198 = ZEXT416((uint)((float)local_19c / (float)local_1a0));
            (*glad_glViewport)(0,0,local_19c,local_1a0);
            (*glad_glClear)(0x4000);
            (*glad_glUseProgram)(local_1a4);
            local_78[0] = 2.0 / ((float)local_198._0_4_ + (float)local_198._0_4_);
            local_78[3] = 0.0;
            local_78[1] = 0.0;
            local_78[2] = 0.0;
            local_78[4] = 0.0;
            local_78[5] = 1.0;
            local_78[6] = 0.0;
            local_78[7] = 0.0;
            local_78[10] = -2.0;
            local_78[0xb] = 0.0;
            local_78[8] = 0.0;
            local_78[9] = 0.0;
            local_78[0xc] =
                 -((float)local_198._0_4_ - (float)local_198._0_4_) /
                 ((float)local_198._0_4_ + (float)local_198._0_4_);
            local_44 = 0xbf80000080000000;
            local_3c = 0x3f800000;
            lVar9 = 0;
            puVar11 = &local_f8;
            do {
              lVar10 = 0;
              do {
                uVar13 = 0x3f800000;
                if (lVar9 != lVar10) {
                  uVar13 = 0;
                }
                *(undefined4 *)((long)puVar11 + lVar10 * 4) = uVar13;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              lVar9 = lVar9 + 1;
              puVar11 = puVar11 + 2;
            } while (lVar9 != 4);
            dVar2 = local_1b0 / 180.0;
            local_c8 = 0xbf800000;
            uStack_c0 = uStack_c0 & 0xffffffff00000000;
            local_1b0 = (double)CONCAT44(local_1b0._4_4_,(float)dVar2);
            local_198._0_4_ = sinf((float)dVar2);
            local_198._4_4_ = extraout_XMM0_Db;
            local_198._8_4_ = extraout_XMM0_Dc;
            local_198._12_4_ = extraout_XMM0_Dd;
            local_148 = cosf(local_1b0._0_4_);
            local_144 = local_198._0_4_;
            local_140 = 0;
            local_138 = local_198._0_4_ ^ 0x80000000;
            local_134 = local_148;
            local_130 = 0;
            uStack_128 = 0;
            local_120 = 0x3f800000;
            local_11c = 0;
            uStack_114 = 0;
            local_10c = 0x3f800000;
            pfVar8 = &local_148;
            lVar9 = 0;
            do {
              lVar10 = 0;
              puVar11 = &local_f8;
              do {
                pfVar1 = (float *)((long)&local_188 + lVar10 * 4 + lVar9 * 0x10);
                *pfVar1 = 0.0;
                fVar14 = 0.0;
                lVar12 = 0;
                do {
                  fVar14 = fVar14 + *(float *)((long)puVar11 + lVar12 * 4) *
                                    *(float *)((long)pfVar8 + lVar12);
                  lVar12 = lVar12 + 4;
                } while (lVar12 != 0x10);
                *pfVar1 = fVar14;
                lVar10 = lVar10 + 1;
                puVar11 = (undefined8 *)((long)puVar11 + 4);
              } while (lVar10 != 4);
              lVar9 = lVar9 + 1;
              pfVar8 = pfVar8 + 4;
            } while (lVar9 != 4);
            local_c8 = local_158;
            uStack_c0 = uStack_150;
            local_d8 = local_168;
            uStack_d0 = uStack_160;
            local_e8 = local_178;
            uStack_e0 = uStack_170;
            local_f8 = local_188;
            uStack_f0 = uStack_180;
            lVar9 = 0;
            puVar11 = &local_f8;
            do {
              lVar10 = 0;
              pfVar8 = local_78;
              do {
                pfVar1 = (float *)((long)&local_188 + lVar10 * 4 + lVar9 * 0x10);
                *pfVar1 = 0.0;
                fVar14 = 0.0;
                lVar12 = 0;
                do {
                  fVar14 = fVar14 + pfVar8[lVar12] * *(float *)((long)puVar11 + lVar12);
                  lVar12 = lVar12 + 4;
                } while (lVar12 != 0x10);
                *pfVar1 = fVar14;
                lVar10 = lVar10 + 1;
                pfVar8 = pfVar8 + 1;
              } while (lVar10 != 4);
              lVar9 = lVar9 + 1;
              puVar11 = puVar11 + 2;
            } while (lVar9 != 4);
            local_88 = local_158;
            uStack_80 = uStack_150;
            local_98 = local_168;
            uStack_90 = uStack_160;
            local_a8 = local_178;
            uStack_a0 = uStack_170;
            local_b8 = local_188;
            uStack_b0 = uStack_180;
            (*glad_glUniformMatrix4fv)(GVar7,1,'\0',(GLfloat *)&local_b8);
            (*glad_glDisable)(0x809d);
            (*glad_glDrawArrays)(6,0,4);
            lVar9 = 0;
            puVar11 = &local_f8;
            do {
              lVar10 = 0;
              do {
                uVar13 = 0x3f800000;
                if (lVar9 != lVar10) {
                  uVar13 = 0;
                }
                *(undefined4 *)((long)puVar11 + lVar10 * 4) = uVar13;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              lVar9 = lVar9 + 1;
              puVar11 = puVar11 + 2;
            } while (lVar9 != 4);
            local_c8 = 0x3f800000;
            uStack_c0 = uStack_c0 & 0xffffffff00000000;
            local_198._0_4_ = sinf(local_1b0._0_4_);
            local_198._4_4_ = extraout_XMM0_Db_00;
            local_198._8_4_ = extraout_XMM0_Dc_00;
            local_198._12_4_ = extraout_XMM0_Dd_00;
            local_148 = cosf(local_1b0._0_4_);
            local_144 = local_198._0_4_;
            local_140 = 0;
            local_138 = local_198._0_4_ ^ 0x80000000;
            local_134 = local_148;
            local_130 = 0;
            uStack_128 = 0;
            local_120 = 0x3f800000;
            local_11c = 0;
            uStack_114 = 0;
            local_10c = 0x3f800000;
            pfVar8 = &local_148;
            lVar9 = 0;
            do {
              lVar10 = 0;
              puVar11 = &local_f8;
              do {
                pfVar1 = (float *)((long)&local_188 + lVar10 * 4 + lVar9 * 0x10);
                *pfVar1 = 0.0;
                fVar14 = 0.0;
                lVar12 = 0;
                do {
                  fVar14 = fVar14 + *(float *)((long)puVar11 + lVar12 * 4) *
                                    *(float *)((long)pfVar8 + lVar12);
                  lVar12 = lVar12 + 4;
                } while (lVar12 != 0x10);
                *pfVar1 = fVar14;
                lVar10 = lVar10 + 1;
                puVar11 = (undefined8 *)((long)puVar11 + 4);
              } while (lVar10 != 4);
              lVar9 = lVar9 + 1;
              pfVar8 = pfVar8 + 4;
            } while (lVar9 != 4);
            local_c8 = local_158;
            uStack_c0 = uStack_150;
            local_d8 = local_168;
            uStack_d0 = uStack_160;
            local_e8 = local_178;
            uStack_e0 = uStack_170;
            local_f8 = local_188;
            uStack_f0 = uStack_180;
            lVar9 = 0;
            puVar11 = &local_f8;
            do {
              lVar10 = 0;
              pfVar8 = local_78;
              do {
                pfVar1 = (float *)((long)&local_188 + lVar10 * 4 + lVar9 * 0x10);
                *pfVar1 = 0.0;
                fVar14 = 0.0;
                lVar12 = 0;
                do {
                  fVar14 = fVar14 + pfVar8[lVar12] * *(float *)((long)puVar11 + lVar12);
                  lVar12 = lVar12 + 4;
                } while (lVar12 != 0x10);
                *pfVar1 = fVar14;
                lVar10 = lVar10 + 1;
                pfVar8 = pfVar8 + 1;
              } while (lVar10 != 4);
              lVar9 = lVar9 + 1;
              puVar11 = puVar11 + 2;
            } while (lVar9 != 4);
            local_88 = local_158;
            uStack_80 = uStack_150;
            local_98 = local_168;
            uStack_90 = uStack_160;
            local_a8 = local_178;
            uStack_a0 = uStack_170;
            local_b8 = local_188;
            uStack_b0 = uStack_180;
            (*glad_glUniformMatrix4fv)(GVar7,1,'\0',(GLfloat *)&local_b8);
            (*glad_glEnable)(0x809d);
            (*glad_glDrawArrays)(6,0,4);
            glfwSwapBuffers(handle);
            glfwPollEvents();
            iVar3 = glfwWindowShouldClose(handle);
          } while (iVar3 == 0);
        }
        glfwDestroyWindow(handle);
        glfwTerminate();
        goto LAB_001113c9;
      }
      glfwTerminate();
    }
  }
  else {
    if (iVar3 == 0x68) {
      usage();
LAB_001113c9:
      exit(0);
    }
    usage();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, samples = 4;
    GLFWwindow* window;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    while ((ch = getopt(argc, argv, "hs:")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 's':
                samples = atoi(optarg);
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (samples)
        printf("Requesting MSAA with %i samples\n", samples);
    else
        printf("Requesting that MSAA not be available\n");

    glfwWindowHint(GLFW_SAMPLES, samples);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(800, 400, "Aliasing Detector", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    glGetIntegerv(GL_SAMPLES, &samples);
    if (samples)
        printf("Context reports MSAA is available with %i samples\n", samples);
    else
        printf("Context reports MSAA is unavailable\n");

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    while (!glfwWindowShouldClose(window))
    {
        float ratio;
        int width, height;
        mat4x4 m, p, mvp;
        const double angle = glfwGetTime() * M_PI / 180.0;

        glfwGetFramebufferSize(window, &width, &height);
        ratio = width / (float) height;

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        glUseProgram(program);

        mat4x4_ortho(p, -ratio, ratio, -1.f, 1.f, 0.f, 1.f);

        mat4x4_translate(m, -1.f, 0.f, 0.f);
        mat4x4_rotate_Z(m, m, (float) angle);
        mat4x4_mul(mvp, p, m);

        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glDisable(GL_MULTISAMPLE);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        mat4x4_translate(m, 1.f, 0.f, 0.f);
        mat4x4_rotate_Z(m, m, (float) angle);
        mat4x4_mul(mvp, p, m);

        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glEnable(GL_MULTISAMPLE);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}